

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O2

void printClauseArray(void)

{
  int *__ptr;
  long lVar1;
  
  if (booleanOptions[2] == 0) {
    __ptr = getIdentityFromZero(clauses);
  }
  else {
    __ptr = getRandomFromZero(clauses);
  }
  for (lVar1 = 0; lVar1 < clauses; lVar1 = lVar1 + 1) {
    printClause(clauseArray + __ptr[lVar1]);
  }
  free(__ptr);
  return;
}

Assistant:

void printClauseArray()
{
    int i;

    int *clauseOrder;

    if (booleanOptions[REORDER])
        clauseOrder = getRandomFromZero (clauses);
    else
        clauseOrder = getIdentityFromZero (clauses);

    for (i=0;i<clauses;i++)
        printClause (&clauseArray[clauseOrder[i]]);

    free (clauseOrder);
}